

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall cmNinjaNormalTargetGenerator::WriteLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  cmOutputConverter *this_00;
  cmNinjaDeps *__x;
  cmGeneratorTarget *this_01;
  cmOSXBundleGenerator *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  cmSourceFile *this_02;
  cmMakefile *this_03;
  cmLocalNinjaGenerator *pcVar3;
  cmGeneratorTarget *this_04;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  pointer pcVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  pointer ppcVar6;
  size_type sVar7;
  bool bVar8;
  bool bVar9;
  __type _Var10;
  TargetType targetType;
  int iVar11;
  TargetType TVar12;
  string *psVar13;
  cmGeneratedFileStream *pcVar14;
  ostream *poVar15;
  char *pcVar16;
  mapped_type *pmVar17;
  string *psVar18;
  cmGlobalNinjaGenerator *pcVar19;
  undefined4 extraout_var;
  mapped_type *flags;
  mapped_type *linkFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar20;
  MapToNinjaPathImpl __unary_op;
  long lVar21;
  ModuleDefinitionInfo *source;
  size_t sVar22;
  cmGlobalNinjaGenerator *this_05;
  string *o;
  cmOutputConverter *pcVar23;
  pointer cc;
  pointer output;
  string *obj;
  pointer pbVar24;
  _Alloc_hider _Var25;
  pointer ppcVar26;
  bool usedResponseFile;
  allocator_type local_7da;
  allocator_type local_7d9;
  string objPath;
  string obj_list_file;
  string rspfile;
  string postBuildCmdLine;
  cmNinjaDeps objs;
  string lwyuFlags;
  string frameworkPath;
  cmNinjaVars vars;
  key_type local_6a8;
  cmLinkLineComputer *local_680;
  string linkPath;
  cmNinjaDeps symlinks;
  string targetOutputReal;
  string cfgName;
  string targetOutput;
  cmNinjaDeps byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preLinkCmdLines;
  cmNinjaVars symlinkVars;
  undefined1 local_338 [32];
  string createRule;
  cmNinjaDeps outputs;
  cmNinjaDeps emptyDeps;
  cmNinjaDeps explicitDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLineLists [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postBuildCmdLines;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  cmNinjaDeps implicitDeps;
  string targetOutputImplib;
  cmNinjaDeps orderOnlyDeps;
  string local_1c8;
  ostringstream comment;
  
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar13 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  std::__cxx11::string::string((string *)&cfgName,(string *)psVar13);
  cmGeneratorTarget::GetFullPath
            ((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact,false);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&targetOutput,&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&symlinkVars);
  cmGeneratorTarget::GetFullPath((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact,true)
  ;
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&targetOutputReal,&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&symlinkVars);
  cmGeneratorTarget::GetFullPath
            ((string *)&symlinkVars,this_01,&cfgName,ImportLibraryArtifact,false);
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&targetOutputImplib,&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&symlinkVars);
  bVar8 = cmGeneratorTarget::IsAppBundleOnApple(this_01);
  if (bVar8) {
    cmGeneratorTarget::GetDirectory((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact);
    cmOSXBundleGenerator::CreateAppBundle
              ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator,&(this->TargetNames).Output,
               (string *)&symlinkVars);
    std::__cxx11::string::_M_assign((string *)&targetOutput);
    std::__cxx11::string::append((char *)&targetOutput);
    std::__cxx11::string::append((string *)&targetOutput);
    cmNinjaTargetGenerator::ConvertToNinjaPath
              ((string *)&comment,&this->super_cmNinjaTargetGenerator,&targetOutput);
    std::__cxx11::string::operator=((string *)&targetOutput,(string *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::_M_assign((string *)&targetOutputReal);
    std::__cxx11::string::append((char *)&targetOutputReal);
    std::__cxx11::string::append((string *)&targetOutputReal);
    cmNinjaTargetGenerator::ConvertToNinjaPath
              ((string *)&comment,&this->super_cmNinjaTargetGenerator,&targetOutputReal);
    std::__cxx11::string::operator=((string *)&targetOutputReal,(string *)&comment);
    std::__cxx11::string::~string((string *)&comment);
  }
  else {
    bVar8 = cmGeneratorTarget::IsFrameworkOnApple(this_01);
    if (bVar8) {
      pcVar1 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact)
      ;
      cmOSXBundleGenerator::CreateFramework
                (pcVar1,&(this->TargetNames).Output,(string *)&symlinkVars);
    }
    else {
      bVar8 = cmGeneratorTarget::IsCFBundleOnApple(this_01);
      if (!bVar8) goto LAB_00252821;
      pcVar1 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact)
      ;
      cmOSXBundleGenerator::CreateCFBundle
                (pcVar1,&(this->TargetNames).Output,(string *)&symlinkVars);
    }
  }
  std::__cxx11::string::~string((string *)&symlinkVars);
LAB_00252821:
  pcVar14 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar14);
  targetType = cmGeneratorTarget::GetType(this_01);
  pcVar14 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  poVar15 = std::operator<<((ostream *)pcVar14,"# Link build statements for ");
  pcVar16 = cmState::GetTargetTypeName(targetType);
  poVar15 = std::operator<<(poVar15,pcVar16);
  poVar15 = std::operator<<(poVar15," target ");
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)&symlinkVars,&this->super_cmNinjaTargetGenerator);
  poVar15 = std::operator<<(poVar15,(string *)&symlinkVars);
  std::operator<<(poVar15,"\n\n");
  std::__cxx11::string::~string((string *)&symlinkVars);
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  poVar15 = std::operator<<((ostream *)&comment,"Link the ");
  pcVar16 = GetVisibleTypeName(this);
  poVar15 = std::operator<<(poVar15,pcVar16);
  poVar15 = std::operator<<(poVar15," ");
  std::operator<<(poVar15,(string *)&targetOutputReal);
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&outputs,&targetOutputReal);
  psVar13 = &this->TargetLinkLanguage;
  bVar8 = std::operator==(psVar13,"Swift");
  if (bVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symlinkVars,"SWIFT_MODULE_NAME",(allocator<char> *)&frameworkPath);
    pcVar16 = cmGeneratorTarget::GetProperty(this_01,(string *)&symlinkVars);
    std::__cxx11::string::~string((string *)&symlinkVars);
    if (pcVar16 == (char *)0x0) {
      psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &symlinkVars,psVar18,".swiftdoc");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frameworkPath,"TARGET_SWIFT_DOC",(allocator<char> *)&linkPath);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&frameworkPath);
      std::__cxx11::string::operator=((string *)pmVar17,(string *)&symlinkVars);
      std::__cxx11::string::~string((string *)&frameworkPath);
      std::__cxx11::string::~string((string *)&symlinkVars);
      psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &symlinkVars,psVar18,".swiftmodule");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frameworkPath,"TARGET_SWIFT_MODULE",(allocator<char> *)&linkPath);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&frameworkPath);
      psVar18 = (string *)&symlinkVars;
      std::__cxx11::string::operator=((string *)pmVar17,(string *)psVar18);
      std::__cxx11::string::~string((string *)&frameworkPath);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frameworkPath,pcVar16,(allocator<char> *)&createRule);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &symlinkVars,&frameworkPath,".swiftdoc");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkPath,"TARGET_SWIFT_DOC",(allocator<char> *)&lwyuFlags);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&linkPath);
      std::__cxx11::string::operator=((string *)pmVar17,(string *)&symlinkVars);
      std::__cxx11::string::~string((string *)&linkPath);
      std::__cxx11::string::~string((string *)&symlinkVars);
      std::__cxx11::string::~string((string *)&frameworkPath);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frameworkPath,pcVar16,(allocator<char> *)&createRule);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &symlinkVars,&frameworkPath,".swiftmodule");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkPath,"TARGET_SWIFT_MODULE",(allocator<char> *)&lwyuFlags);
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&linkPath);
      std::__cxx11::string::operator=((string *)pmVar17,(string *)&symlinkVars);
      std::__cxx11::string::~string((string *)&linkPath);
      std::__cxx11::string::~string((string *)&symlinkVars);
      psVar18 = &frameworkPath;
    }
    std::__cxx11::string::~string((string *)psVar18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symlinkVars,"TARGET_SWIFT_DOC",(allocator<char> *)&frameworkPath);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&outputs,pmVar17);
    std::__cxx11::string::~string((string *)&symlinkVars);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symlinkVars,"TARGET_SWIFT_MODULE",(allocator<char> *)&frameworkPath);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&outputs,pmVar17);
    std::__cxx11::string::~string((string *)&symlinkVars);
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffffffffff00);
    objPath._M_dataplus._M_p = (pointer)0x0;
    objPath._M_string_length = 0;
    objPath.field_2._M_allocated_capacity = 0;
    psVar18 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
    cmGeneratorTarget::GetObjectSources
              (this_01,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                       &objPath,psVar18);
    sVar7 = objPath._M_string_length;
    for (_Var25 = objPath._M_dataplus; _Var25._M_p != (pointer)sVar7; _Var25._M_p = _Var25._M_p + 8)
    {
      this_02 = *(cmSourceFile **)_Var25._M_p;
      std::__cxx11::string::append((char *)&symlinkVars);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frameworkPath,"SWIFT_PARTIAL_MODULE",(allocator<char> *)&linkPath);
      pcVar16 = cmSourceFile::GetProperty(this_02,&frameworkPath);
      std::__cxx11::string::~string((string *)&frameworkPath);
      if (pcVar16 == (char *)0x0) {
        (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
                  (&lwyuFlags,pcVar2,this_01);
        std::operator+(&createRule,&lwyuFlags,"/");
        psVar18 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this_01,this_02);
        std::operator+(&linkPath,&createRule,psVar18);
        std::operator+(&frameworkPath,&linkPath,".swiftmodule");
        std::__cxx11::string::append((string *)&symlinkVars);
        std::__cxx11::string::~string((string *)&frameworkPath);
        std::__cxx11::string::~string((string *)&linkPath);
        std::__cxx11::string::~string((string *)&createRule);
        std::__cxx11::string::~string((string *)&lwyuFlags);
      }
      else {
        std::__cxx11::string::append((char *)&symlinkVars);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&frameworkPath,"SWIFT_PARTIAL_MODULES",(allocator<char> *)&linkPath);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&frameworkPath);
    std::__cxx11::string::_M_assign((string *)pmVar17);
    std::__cxx11::string::~string((string *)&frameworkPath);
    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
              ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&objPath
              );
    std::__cxx11::string::~string((string *)&symlinkVars);
  }
  __x = &(this->super_cmNinjaTargetGenerator).Objects;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explicitDeps,__x);
  cmNinjaTargetGenerator::ComputeLinkDeps(&implicitDeps,&this->super_cmNinjaTargetGenerator,psVar13)
  ;
  if ((this->DeviceLinkObject)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&explicitDeps,&this->DeviceLinkObject);
  }
  this_03 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  psVar18 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,this_01,psVar13,psVar18);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&symlinkVars,
                 &createRule,"_USE_WATCOM_QUOTE");
  bVar8 = cmMakefile::IsOn(this_03,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&symlinkVars);
  pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  this_00 = &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat((string *)&symlinkVars,this_00,&targetOutputReal,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lwyuFlags,"TARGET_FILE",(allocator<char> *)&objPath);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::operator=((string *)pmVar17,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&lwyuFlags);
  std::__cxx11::string::~string((string *)&symlinkVars);
  pcVar19 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar3 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar23 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar3 == (cmLocalNinjaGenerator *)0x0) {
    pcVar23 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&lwyuFlags,(cmLocalGenerator *)pcVar3);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&symlinkVars,(cmStateSnapshot *)&lwyuFlags);
  iVar11 = (*(pcVar19->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0xe])(pcVar19,pcVar23,&symlinkVars);
  local_680 = (cmLinkLineComputer *)CONCAT44(extraout_var,iVar11);
  cmLinkLineComputer::SetUseWatcomQuote(local_680,bVar8);
  psVar18 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&symlinkVars,"LINK_LIBRARIES",(allocator<char> *)&postBuildCmdLine);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,(key_type *)&symlinkVars);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lwyuFlags,"FLAGS",(allocator<char> *)&rspfile);
  flags = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&objPath,"LINK_FLAGS",(allocator<char> *)&obj_list_file);
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
  cmLocalGenerator::GetTargetFlags
            ((cmLocalGenerator *)pcVar2,local_680,psVar18,pmVar17,flags,linkFlags,&frameworkPath,
             &linkPath,this_01);
  std::__cxx11::string::~string((string *)&objPath);
  std::__cxx11::string::~string((string *)&lwyuFlags);
  std::__cxx11::string::~string((string *)&symlinkVars);
  TVar12 = cmGeneratorTarget::GetType
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  if ((TVar12 == SHARED_LIBRARY) ||
     (TVar12 = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget), TVar12 == MODULE_LIBRARY)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symlinkVars,"LINK_FLAGS",(allocator<char> *)&lwyuFlags);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    cmCommonTargetGenerator::AppendOSXVerFlag
              ((cmCommonTargetGenerator *)this,pmVar17,psVar13,"COMPATIBILITY",true);
    std::__cxx11::string::~string((string *)&symlinkVars);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symlinkVars,"LINK_FLAGS",(allocator<char> *)&lwyuFlags);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    cmCommonTargetGenerator::AppendOSXVerFlag
              ((cmCommonTargetGenerator *)this,pmVar17,psVar13,"CURRENT",false);
    std::__cxx11::string::~string((string *)&symlinkVars);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&symlinkVars,"JOB_POOL_LINK",(allocator<char> *)&lwyuFlags);
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars,this_01,&vars);
  std::__cxx11::string::~string((string *)&symlinkVars);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&symlinkVars,"LINK_FLAGS",(allocator<char> *)&lwyuFlags);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,(key_type *)&symlinkVars);
  cmCommonTargetGenerator::AddModuleDefinitionFlag
            ((cmCommonTargetGenerator *)this,local_680,pmVar17);
  std::__cxx11::string::~string((string *)&symlinkVars);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lwyuFlags,"LINK_FLAGS",(allocator<char> *)&postBuildCmdLine);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  cmGlobalNinjaGenerator::EncodeLiteral((string *)&symlinkVars,pmVar17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&objPath,"LINK_FLAGS",(allocator<char> *)&rspfile);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::operator=((string *)pmVar17,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&objPath);
  std::__cxx11::string::~string((string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&lwyuFlags);
  cmCommonTargetGenerator::GetManifests_abi_cxx11_
            ((string *)&symlinkVars,(cmCommonTargetGenerator *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lwyuFlags,"MANIFESTS",(allocator<char> *)&objPath);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::operator=((string *)pmVar17,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&lwyuFlags);
  std::__cxx11::string::~string((string *)&symlinkVars);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&symlinkVars,
                 &frameworkPath,&linkPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lwyuFlags,"LINK_PATH",(allocator<char> *)&objPath);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::operator=((string *)pmVar17,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&lwyuFlags);
  std::__cxx11::string::~string((string *)&symlinkVars);
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  lwyuFlags._M_string_length = 0;
  lwyuFlags.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&symlinkVars,"LINK_WHAT_YOU_USE",(allocator<char> *)&objPath);
  bVar8 = cmGeneratorTarget::GetPropertyAsBool(this_01,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&symlinkVars);
  if (bVar8) {
    std::__cxx11::string::assign((char *)&lwyuFlags);
  }
  if (targetType == EXECUTABLE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&objPath,"FLAGS",(allocator<char> *)&postBuildCmdLine);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::string((string *)&symlinkVars,(string *)pmVar17);
    std::__cxx11::string::~string((string *)&objPath);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)pcVar2,(string *)&symlinkVars,this_01,psVar13,&cfgName);
    std::__cxx11::string::append((string *)&symlinkVars);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&objPath,"FLAGS",(allocator<char> *)&postBuildCmdLine);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar17);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&objPath,"ARCH_FLAGS",(allocator<char> *)&postBuildCmdLine);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::string((string *)&symlinkVars,(string *)pmVar17);
    std::__cxx11::string::~string((string *)&objPath);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)pcVar2,(string *)&symlinkVars,this_01,psVar13,&cfgName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&objPath,"ARCH_FLAGS",(allocator<char> *)&postBuildCmdLine);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar17);
    std::__cxx11::string::~string((string *)&objPath);
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    *(undefined1 *)symlinkVars._M_t._M_impl._0_8_ = 0;
    std::__cxx11::string::append((string *)&symlinkVars);
    cmLocalGenerator::AddLanguageFlagsForLinking
              ((cmLocalGenerator *)pcVar2,(string *)&symlinkVars,this_01,psVar13,&cfgName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&objPath,"LANGUAGE_COMPILE_FLAGS",(allocator<char> *)&postBuildCmdLine);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar17);
  }
  std::__cxx11::string::~string((string *)&objPath);
  std::__cxx11::string::~string((string *)&symlinkVars);
  bVar8 = cmGeneratorTarget::HasSOName
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,&cfgName);
  if (bVar8) {
    cmMakefile::GetSONameFlag(this_03,psVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symlinkVars,"SONAME_FLAG",(allocator<char> *)&objPath);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::__cxx11::string::assign((char *)pmVar17);
    std::__cxx11::string::~string((string *)&symlinkVars);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symlinkVars,"SONAME",(allocator<char> *)&objPath);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::__cxx11::string::_M_assign((string *)pmVar17);
    std::__cxx11::string::~string((string *)&symlinkVars);
    if (targetType == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)&symlinkVars,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 &cfgName);
      if (symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
        cmOutputConverter::ConvertToOutputFormat(&objPath,this_00,(string *)&symlinkVars,SHELL);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&postBuildCmdLine,"INSTALLNAME_DIR",(allocator<char> *)&rspfile);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&vars,&postBuildCmdLine);
        std::__cxx11::string::operator=((string *)pmVar17,(string *)&objPath);
        std::__cxx11::string::~string((string *)&postBuildCmdLine);
        std::__cxx11::string::~string((string *)&objPath);
      }
      std::__cxx11::string::~string((string *)&symlinkVars);
    }
  }
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->TargetNames).ImportLibrary._M_string_length != 0) {
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,this_00,&targetOutputImplib,SHELL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&objPath,"TARGET_IMPLIB",(allocator<char> *)&postBuildCmdLine);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar17);
    std::__cxx11::string::~string((string *)&objPath);
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
    bVar8 = cmGeneratorTarget::HasImportLibrary(this_01,&cfgName);
    if (bVar8) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&byproducts,&targetOutputImplib);
    }
    std::__cxx11::string::~string((string *)&symlinkVars);
  }
  bVar8 = cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
                    (&this->super_cmNinjaTargetGenerator,&vars);
  if (!bVar8) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    objPath._M_string_length = 0;
    postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
    postBuildCmdLine._M_string_length = 0;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffffffffff00);
    objPath.field_2._M_allocated_capacity =
         objPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
    postBuildCmdLine.field_2._M_local_buf[0] = '\0';
    this_04 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"",(allocator<char> *)&obj_list_file);
    cmGeneratorTarget::GetFullNameComponents
              (this_04,(string *)&symlinkVars,&objPath,&postBuildCmdLine,&rspfile,
               RuntimeBinaryArtifact);
    std::__cxx11::string::~string((string *)&rspfile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,".dbg",(allocator<char> *)&obj_list_file);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj_list_file,"CMAKE_DEBUG_SYMBOL_SUFFIX",(allocator<char> *)&objs);
    pcVar16 = cmMakefile::GetDefinition(this_03,&obj_list_file);
    std::__cxx11::string::~string((string *)&obj_list_file);
    if (pcVar16 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&obj_list_file,"CMAKE_DEBUG_SYMBOL_SUFFIX",(allocator<char> *)&objs);
      cmMakefile::GetDefinition(this_03,&obj_list_file);
      std::__cxx11::string::assign((char *)&rspfile);
      std::__cxx11::string::~string((string *)&obj_list_file);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objs,
                   &objPath,&postBuildCmdLine);
    std::operator+(&obj_list_file,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objs,
                   &rspfile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a8,"TARGET_PDB",(allocator<char> *)local_338);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&local_6a8);
    std::__cxx11::string::operator=((string *)pmVar17,(string *)&obj_list_file);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::~string((string *)&obj_list_file);
    std::__cxx11::string::~string((string *)&objs);
    std::__cxx11::string::~string((string *)&rspfile);
    std::__cxx11::string::~string((string *)&postBuildCmdLine);
    std::__cxx11::string::~string((string *)&objPath);
    std::__cxx11::string::~string((string *)&symlinkVars);
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar3 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&postBuildCmdLine,&this->super_cmNinjaTargetGenerator,&objPath);
  cmOutputConverter::ConvertToOutputFormat
            ((string *)&symlinkVars,
             &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &postBuildCmdLine,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"OBJECT_DIR",(allocator<char> *)&obj_list_file);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar17,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&postBuildCmdLine);
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  pcVar19 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  if (pcVar19->UsingGCCOnWindows == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symlinkVars,"LINK_LIBRARIES",(allocator<char> *)&postBuildCmdLine);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::__cxx11::string::~string((string *)&symlinkVars);
    _Var4._M_current = (pmVar17->_M_dataplus)._M_p;
    symlinkVars._M_t._M_impl._0_1_ = 0x5c;
    postBuildCmdLine._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (_Var4,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_Var4._M_current + pmVar17->_M_string_length),(char *)&symlinkVars,
               (char *)&postBuildCmdLine);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symlinkVars,"LINK_PATH",(allocator<char> *)&postBuildCmdLine);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::__cxx11::string::~string((string *)&symlinkVars);
    _Var4._M_current = (pmVar17->_M_dataplus)._M_p;
    symlinkVars._M_t._M_impl._0_1_ = 0x5c;
    postBuildCmdLine._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (_Var4,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_Var4._M_current + pmVar17->_M_string_length),(char *)&symlinkVars,
               (char *)&postBuildCmdLine);
  }
  cmdLists[0] = cmGeneratorTarget::GetPreBuildCommands(this_01);
  cmdLists[1] = cmGeneratorTarget::GetPreLinkCommands(this_01);
  cmdLists[2] = cmGeneratorTarget::GetPostBuildCommands(this_01);
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdLineLists[0] = &preLinkCmdLines;
  cmdLineLists[1] = &preLinkCmdLines;
  cmdLineLists[2] = &postBuildCmdLines;
  for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
    pcVar5 = (cmdLists[lVar21]->
             super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (cc = (cmdLists[lVar21]->
              super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
              super__Vector_impl_data._M_start; cc != pcVar5; cc = cc + 1) {
      std::__cxx11::string::string((string *)&local_1c8,(string *)&cfgName);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&symlinkVars,cc,&local_1c8,
                 (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
      std::__cxx11::string::~string((string *)&local_1c8);
      cmLocalNinjaGenerator::AppendCustomCommandLines
                (pcVar2,(cmCustomCommandGenerator *)&symlinkVars,cmdLineLists[lVar21]);
      pvVar20 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)&symlinkVars);
      __first._M_current =
           (pvVar20->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (pvVar20->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      __unary_op.GG =
           cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (__first,__last,&byproducts,__unary_op);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&symlinkVars);
    }
  }
  psVar18 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  source = cmGeneratorTarget::GetModuleDefinitionInfo(this_01,psVar18);
  if ((source != (ModuleDefinitionInfo *)0x0) && (source->DefFileGenerated == true)) {
    pcVar3 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar18 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&postBuildCmdLine,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar18,SHELL);
    std::__cxx11::string::string((string *)&rspfile,(string *)&postBuildCmdLine);
    std::__cxx11::string::append((char *)&rspfile);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).super_cmLocalGenerator.super_cmOutputConverter,&source->DefFile,SHELL);
    std::__cxx11::string::append((string *)&rspfile);
    std::__cxx11::string::~string((string *)&symlinkVars);
    std::__cxx11::string::append((char *)&rspfile);
    std::operator+(&obj_list_file,&source->DefFile,".objs");
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).super_cmLocalGenerator.super_cmOutputConverter,&obj_list_file,SHELL);
    std::__cxx11::string::append((string *)&rspfile);
    std::__cxx11::string::~string((string *)&symlinkVars);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&preLinkCmdLines
               ,&rspfile);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&symlinkVars,&obj_list_file,false,None);
    if (source->WindowsExportAllSymbols == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&objs,__x);
      for (pbVar24 = objs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar24 !=
          objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar24 = pbVar24 + 1) {
        bVar8 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(pbVar24,(char (*) [5])".obj");
        if (bVar8) {
          poVar15 = std::operator<<((ostream *)&symlinkVars,(string *)pbVar24);
          std::operator<<(poVar15,"\n");
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&objs);
    }
    ppcVar6 = (source->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar26 = (source->Sources).
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppcVar26 != ppcVar6;
        ppcVar26 = ppcVar26 + 1) {
      psVar18 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar26);
      poVar15 = std::operator<<((ostream *)&symlinkVars,(string *)psVar18);
      std::operator<<(poVar15,"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&symlinkVars);
    std::__cxx11::string::~string((string *)&obj_list_file);
    std::__cxx11::string::~string((string *)&rspfile);
    std::__cxx11::string::~string((string *)&postBuildCmdLine);
  }
  if (preLinkCmdLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      preLinkCmdLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar18 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    cmOutputConverter::ConvertToOutputFormat((string *)&symlinkVars,this_00,psVar18,SHELL);
    std::operator+(&postBuildCmdLine,"cd ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&symlinkVars
                  );
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&preLinkCmdLines
               ,&postBuildCmdLine);
    std::__cxx11::string::~string((string *)&postBuildCmdLine);
    std::__cxx11::string::~string((string *)&symlinkVars);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&postBuildCmdLine,"pre-link",(allocator<char> *)&obj_list_file);
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)&symlinkVars,pcVar2,&preLinkCmdLines,&postBuildCmdLine,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"PRE_LINK",(allocator<char> *)&objs);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar17,(string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&symlinkVars);
  std::__cxx11::string::~string((string *)&postBuildCmdLine);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&symlinkVars,"post-build",(allocator<char> *)&rspfile);
  cmLocalNinjaGenerator::BuildCommandLine
            (&postBuildCmdLine,pcVar2,&postBuildCmdLines,(string *)&symlinkVars,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&symlinkVars);
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar8 = std::operator!=(&targetOutput,&targetOutputReal);
  if ((!bVar8) || (bVar8 = cmGeneratorTarget::IsFrameworkOnApple(this_01), bVar8)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"POST_BUILD",(allocator<char> *)&obj_list_file);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar17);
    std::__cxx11::string::~string((string *)&rspfile);
    bVar8 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"POST_BUILD",(allocator<char> *)&obj_list_file);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar17);
    std::__cxx11::string::~string((string *)&rspfile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"POST_BUILD",(allocator<char> *)&obj_list_file);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&symlinkVars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar17);
    std::__cxx11::string::~string((string *)&rspfile);
    bVar8 = true;
  }
  pcVar19 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar9 = std::operator==(psVar13,"RC");
  if (((bVar9) || (bVar9 = std::operator==(psVar13,"CUDA"), bVar9)) ||
     (bVar9 = cmNinjaTargetGenerator::ForceResponseFile(&this->super_cmNinjaTargetGenerator), !bVar9
     )) {
    sVar22 = cmSystemTools::CalculateCommandLineLengthLimit();
    LanguageLinkerRule_abi_cxx11_(&rspfile,this);
    iVar11 = cmGlobalNinjaGenerator::GetRuleCmdLength(pcVar19,&rspfile);
    iVar11 = (int)sVar22 - iVar11;
    std::__cxx11::string::~string((string *)&rspfile);
  }
  else {
    iVar11 = -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"CMakeFiles/",(allocator<char> *)local_338);
  psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objs,
                 &local_6a8,psVar13);
  std::operator+(&obj_list_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objs,".rsp");
  cmNinjaTargetGenerator::ConvertToNinjaPath
            (&rspfile,&this->super_cmNinjaTargetGenerator,&obj_list_file);
  std::__cxx11::string::~string((string *)&obj_list_file);
  std::__cxx11::string::~string((string *)&objs);
  std::__cxx11::string::~string((string *)&local_6a8);
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &orderOnlyDeps,DependOnTargetArtifact);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&obj_list_file,"RESTAT",(allocator<char> *)&objs);
  pmVar17 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&obj_list_file);
  std::__cxx11::string::assign((char *)pmVar17);
  std::__cxx11::string::~string((string *)&obj_list_file);
  pbVar24 = byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (output = byproducts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; output != pbVar24; output = output + 1) {
    this_05 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::SeenCustomCommandOutput(this_05,output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&outputs,output);
  }
  usedResponseFile = false;
  pcVar14 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::stringbuf::str();
  LanguageLinkerRule_abi_cxx11_((string *)&objs,this);
  local_6a8._M_dataplus._M_p = (pointer)0x0;
  local_6a8._M_string_length = 0;
  local_6a8.field_2._M_allocated_capacity = 0;
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar19,(ostream *)pcVar14,&obj_list_file,(string *)&objs,&outputs,
             (cmNinjaDeps *)&local_6a8,&explicitDeps,&implicitDeps,&orderOnlyDeps,&vars,&rspfile,
             iVar11,&usedResponseFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_6a8);
  std::__cxx11::string::~string((string *)&objs);
  std::__cxx11::string::~string((string *)&obj_list_file);
  WriteLinkRule(this,usedResponseFile);
  if (bVar8) {
    if (targetType == EXECUTABLE) {
      pcVar14 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::operator+(&obj_list_file,"Create executable symlink ",&targetOutput);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&objs,"CMAKE_SYMLINK_EXECUTABLE",(allocator<char> *)&local_238);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_338,1,&targetOutput,&local_7d9);
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_5b8,1,&targetOutputReal,&local_7da);
      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
      local_6a8._M_string_length = 0;
      local_6a8.field_2._M_allocated_capacity =
           local_6a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar19,(ostream *)pcVar14,&obj_list_file,(string *)&objs,(cmNinjaDeps *)local_338,
                 &symlinks,&local_5b8,&emptyDeps,&emptyDeps,&symlinkVars,&local_6a8,0,(bool *)0x0);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_5b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&symlinks);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_338);
      std::__cxx11::string::~string((string *)&objs);
      std::__cxx11::string::~string((string *)&obj_list_file);
    }
    else {
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmNinjaTargetGenerator::GetTargetFilePath
                ((string *)&objs,&this->super_cmNinjaTargetGenerator,
                 &(this->TargetNames).SharedObject);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&obj_list_file,&this->super_cmNinjaTargetGenerator,(string *)&objs);
      std::__cxx11::string::~string((string *)&objs);
      _Var10 = std::operator==(&targetOutputReal,&obj_list_file);
      if ((_Var10) || (_Var10 = std::operator==(&targetOutput,&obj_list_file), _Var10)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&objs,"SONAME",(allocator<char> *)&local_6a8);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&symlinkVars,(key_type *)&objs);
        std::__cxx11::string::_M_assign((string *)pmVar17);
        std::__cxx11::string::~string((string *)&objs);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&objs,"SONAME",(allocator<char> *)&local_6a8);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&symlinkVars,(key_type *)&objs);
        pmVar17->_M_string_length = 0;
        *(pmVar17->_M_dataplus)._M_p = '\0';
        std::__cxx11::string::~string((string *)&objs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&symlinks,&obj_list_file);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&symlinks,&targetOutput);
      pcVar14 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objs,
                     "Create library symlink ",&targetOutput);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a8,"CMAKE_SYMLINK_LIBRARY",(allocator<char> *)&local_7d9);
      local_5b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_5b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_5b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_238,1,&targetOutputReal,&local_7da);
      local_338._0_8_ = local_338 + 0x10;
      local_338._8_8_ = (pointer)0x0;
      local_338[0x10] = '\0';
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar19,(ostream *)pcVar14,(string *)&objs,&local_6a8,&symlinks,&local_5b8,
                 &local_238,&emptyDeps,&emptyDeps,&symlinkVars,(string *)local_338,0,(bool *)0x0);
      std::__cxx11::string::~string((string *)local_338);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_238);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_5b8);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::__cxx11::string::~string((string *)&objs);
      std::__cxx11::string::~string((string *)&obj_list_file);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&symlinks);
    }
  }
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar19,&(this->TargetNames).Output,this_01);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            (&obj_list_file,&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar19,&obj_list_file,this_01);
  std::__cxx11::string::~string((string *)&obj_list_file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&orderOnlyDeps);
  std::__cxx11::string::~string((string *)&rspfile);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&symlinkVars._M_t);
  std::__cxx11::string::~string((string *)&postBuildCmdLine);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&postBuildCmdLines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&preLinkCmdLines);
  std::__cxx11::string::~string((string *)&objPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::__cxx11::string::~string((string *)&lwyuFlags);
  (*local_680->_vptr_cmLinkLineComputer[1])();
  std::__cxx11::string::~string((string *)&createRule);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&emptyDeps);
  std::__cxx11::string::~string((string *)&targetOutputImplib);
  std::__cxx11::string::~string((string *)&targetOutputReal);
  std::__cxx11::string::~string((string *)&targetOutput);
  std::__cxx11::string::~string((string *)&cfgName);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkStatement()
{
  cmGeneratorTarget& gt = *this->GetGeneratorTarget();
  const std::string cfgName = this->GetConfigName();
  std::string targetOutput = ConvertToNinjaPath(gt.GetFullPath(cfgName));
  std::string targetOutputReal = ConvertToNinjaPath(
    gt.GetFullPath(cfgName, cmStateEnums::RuntimeBinaryArtifact,
                   /*realname=*/true));
  std::string targetOutputImplib = ConvertToNinjaPath(
    gt.GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  if (gt.IsAppBundleOnApple()) {
    // Create the app bundle
    std::string outpath = gt.GetDirectory(cfgName);
    this->OSXBundleGenerator->CreateAppBundle(this->TargetNames.Output,
                                              outpath);

    // Calculate the output path
    targetOutput = outpath;
    targetOutput += "/";
    targetOutput += this->TargetNames.Output;
    targetOutput = this->ConvertToNinjaPath(targetOutput);
    targetOutputReal = outpath;
    targetOutputReal += "/";
    targetOutputReal += this->TargetNames.Real;
    targetOutputReal = this->ConvertToNinjaPath(targetOutputReal);
  } else if (gt.IsFrameworkOnApple()) {
    // Create the library framework.
    this->OSXBundleGenerator->CreateFramework(this->TargetNames.Output,
                                              gt.GetDirectory(cfgName));
  } else if (gt.IsCFBundleOnApple()) {
    // Create the core foundation bundle.
    this->OSXBundleGenerator->CreateCFBundle(this->TargetNames.Output,
                                             gt.GetDirectory(cfgName));
  }

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = gt.GetType();
  this->GetBuildFileStream()
    << "# Link build statements for " << cmState::GetTargetTypeName(targetType)
    << " target " << this->GetTargetName() << "\n\n";

  cmNinjaDeps emptyDeps;
  cmNinjaVars vars;

  // Compute the comment.
  std::ostringstream comment;
  comment << "Link the " << this->GetVisibleTypeName() << " "
          << targetOutputReal;

  // Compute outputs.
  cmNinjaDeps outputs;
  outputs.push_back(targetOutputReal);

  if (this->TargetLinkLanguage == "Swift") {
    if (const char* name = gt.GetProperty("SWIFT_MODULE_NAME")) {
      vars["TARGET_SWIFT_DOC"] = std::string(name) + ".swiftdoc";
      vars["TARGET_SWIFT_MODULE"] = std::string(name) + ".swiftmodule";
    } else {
      vars["TARGET_SWIFT_DOC"] = gt.GetName() + ".swiftdoc";
      vars["TARGET_SWIFT_MODULE"] = gt.GetName() + ".swiftmodule";
    }
    outputs.push_back(vars["TARGET_SWIFT_DOC"]);
    outputs.push_back(vars["TARGET_SWIFT_MODULE"]);

    cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

    std::string partials;
    std::vector<cmSourceFile const*> sources;
    gt.GetObjectSources(sources, this->GetConfigName());
    for (cmSourceFile const* source : sources) {
      partials += " ";
      if (const char* partial = source->GetProperty("SWIFT_PARTIAL_MODULE")) {
        partials += partial;
      } else {
        partials += localGen.GetTargetDirectory(&gt) + "/" +
          gt.GetObjectName(source) + ".swiftmodule";
      }
    }
    vars["SWIFT_PARTIAL_MODULES"] = partials;
  }

  // Compute specific libraries to link with.
  cmNinjaDeps explicitDeps = this->GetObjects();
  cmNinjaDeps implicitDeps = this->ComputeLinkDeps(this->TargetLinkLanguage);

  if (!this->DeviceLinkObject.empty()) {
    explicitDeps.push_back(this->DeviceLinkObject);
  }

  cmMakefile* mf = this->GetMakefile();

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    gt.GetCreateRuleVariable(this->TargetLinkLanguage, this->GetConfigName());
  bool useWatcomQuote = mf->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    this->GetGlobalGenerator()->CreateLinkLineComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory()));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(linkLineComputer.get(), this->GetConfigName(),
                          vars["LINK_LIBRARIES"], vars["FLAGS"],
                          vars["LINK_FLAGS"], frameworkPath, linkPath, &gt);

  // Add OS X version flags, if any.
  if (this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
    this->AppendOSXVerFlag(vars["LINK_FLAGS"], this->TargetLinkLanguage,
                           "COMPATIBILITY", true);
    this->AppendOSXVerFlag(vars["LINK_FLAGS"], this->TargetLinkLanguage,
                           "CURRENT", false);
  }

  this->addPoolNinjaVariable("JOB_POOL_LINK", &gt, vars);

  this->AddModuleDefinitionFlag(linkLineComputer.get(), vars["LINK_FLAGS"]);
  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;
  std::string lwyuFlags;
  if (gt.GetPropertyAsBool("LINK_WHAT_YOU_USE")) {
    lwyuFlags = " -Wl,--no-as-needed";
  }

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, &gt, TargetLinkLanguage, cfgName);
    t += lwyuFlags;
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, &gt, TargetLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t.clear();
    t += lwyuFlags;
    localGen.AddLanguageFlagsForLinking(t, &gt, TargetLinkLanguage, cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (this->GetGeneratorTarget()->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] = mf->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNames.SharedObject;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  cmNinjaDeps byproducts;

  if (!this->TargetNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
    if (gt.HasImportLibrary(cfgName)) {
      byproducts.push_back(targetOutputImplib);
    }
  }

  if (!this->SetMsvcTargetPdbVariable(vars)) {
    // It is common to place debug symbols at a specific place,
    // so we need a plain target name in the rule available.
    std::string prefix;
    std::string base;
    std::string suffix;
    this->GetGeneratorTarget()->GetFullNameComponents(prefix, base, suffix);
    std::string dbg_suffix = ".dbg";
    // TODO: Where to document?
    if (mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX")) {
      dbg_suffix = mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX");
    }
    vars["TARGET_PDB"] = base + suffix + dbg_suffix;
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  const std::vector<cmCustomCommand>* cmdLists[3] = {
    &gt.GetPreBuildCommands(), &gt.GetPreLinkCommands(),
    &gt.GetPostBuildCommands()
  };

  std::vector<std::string> preLinkCmdLines, postBuildCmdLines;
  std::vector<std::string>* cmdLineLists[3] = { &preLinkCmdLines,
                                                &preLinkCmdLines,
                                                &postBuildCmdLines };

  for (unsigned i = 0; i != 3; ++i) {
    for (cmCustomCommand const& cc : *cmdLists[i]) {
      cmCustomCommandGenerator ccg(cc, cfgName, this->GetLocalGenerator());
      localGen.AppendCustomCommandLines(ccg, *cmdLineLists[i]);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(byproducts), MapToNinjaPath());
    }
  }

  // maybe create .def file from list of objects
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    gt.GetModuleDefinitionInfo(this->GetConfigName());
  if (mdi && mdi->DefFileGenerated) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    std::string cmd = cmakeCommand;
    cmd += " -E __create_def ";
    cmd += this->GetLocalGenerator()->ConvertToOutputFormat(
      mdi->DefFile, cmOutputConverter::SHELL);
    cmd += " ";
    std::string obj_list_file = mdi->DefFile + ".objs";
    cmd += this->GetLocalGenerator()->ConvertToOutputFormat(
      obj_list_file, cmOutputConverter::SHELL);
    preLinkCmdLines.push_back(std::move(cmd));

    // create a list of obj files for the -E __create_def to read
    cmGeneratedFileStream fout(obj_list_file);

    if (mdi->WindowsExportAllSymbols) {
      cmNinjaDeps objs = this->GetObjects();
      for (std::string const& obj : objs) {
        if (cmHasLiteralSuffix(obj, ".obj")) {
          fout << obj << "\n";
        }
      }
    }

    for (cmSourceFile const* src : mdi->Sources) {
      fout << src->GetFullPath() << "\n";
    }
  }
  // If we have any PRE_LINK commands, we need to go back to CMAKE_BINARY_DIR
  // for
  // the link commands.
  if (!preLinkCmdLines.empty()) {
    const std::string homeOutDir = localGen.ConvertToOutputFormat(
      localGen.GetBinaryDirectory(), cmOutputConverter::SHELL);
    preLinkCmdLines.push_back("cd " + homeOutDir);
  }

  vars["PRE_LINK"] = localGen.BuildCommandLine(preLinkCmdLines, "pre-link",
                                               this->GeneratorTarget);
  std::string postBuildCmdLine = localGen.BuildCommandLine(
    postBuildCmdLines, "post-build", this->GeneratorTarget);

  cmNinjaVars symlinkVars;
  bool const symlinkNeeded =
    (targetOutput != targetOutputReal && !gt.IsFrameworkOnApple());
  if (!symlinkNeeded) {
    vars["POST_BUILD"] = postBuildCmdLine;
  } else {
    vars["POST_BUILD"] = cmGlobalNinjaGenerator::SHELL_NOOP;
    symlinkVars["POST_BUILD"] = postBuildCmdLine;
  }
  cmGlobalNinjaGenerator& globalGen = *this->GetGlobalGenerator();

  bool const lang_supports_response =
    !(this->TargetLinkLanguage == "RC" || this->TargetLinkLanguage == "CUDA");
  int commandLineLengthLimit = -1;
  if (!lang_supports_response || !this->ForceResponseFile()) {
    commandLineLengthLimit =
      static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
      globalGen.GetRuleCmdLength(this->LanguageLinkerRule());
  }

  const std::string rspfile = this->ConvertToNinjaPath(
    std::string("CMakeFiles/") + gt.GetName() + ".rsp");

  // Gather order-only dependencies.
  cmNinjaDeps orderOnlyDeps;
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 orderOnlyDeps);

  // Ninja should restat after linking if and only if there are byproducts.
  vars["RESTAT"] = byproducts.empty() ? "" : "1";

  for (std::string const& o : byproducts) {
    this->GetGlobalGenerator()->SeenCustomCommandOutput(o);
    outputs.push_back(o);
  }

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen.WriteBuild(this->GetBuildFileStream(), comment.str(),
                       this->LanguageLinkerRule(), outputs,
                       /*implicitOuts=*/cmNinjaDeps(), explicitDeps,
                       implicitDeps, orderOnlyDeps, vars, rspfile,
                       commandLineLengthLimit, &usedResponseFile);
  this->WriteLinkRule(usedResponseFile);

  if (symlinkNeeded) {
    if (targetType == cmStateEnums::EXECUTABLE) {
      globalGen.WriteBuild(
        this->GetBuildFileStream(),
        "Create executable symlink " + targetOutput,
        "CMAKE_SYMLINK_EXECUTABLE", cmNinjaDeps(1, targetOutput),
        /*implicitOuts=*/cmNinjaDeps(), cmNinjaDeps(1, targetOutputReal),
        emptyDeps, emptyDeps, symlinkVars);
    } else {
      cmNinjaDeps symlinks;
      std::string const soName = this->ConvertToNinjaPath(
        this->GetTargetFilePath(this->TargetNames.SharedObject));
      // If one link has to be created.
      if (targetOutputReal == soName || targetOutput == soName) {
        symlinkVars["SONAME"] = soName;
      } else {
        symlinkVars["SONAME"].clear();
        symlinks.push_back(soName);
      }
      symlinks.push_back(targetOutput);
      globalGen.WriteBuild(
        this->GetBuildFileStream(), "Create library symlink " + targetOutput,
        "CMAKE_SYMLINK_LIBRARY", symlinks,
        /*implicitOuts=*/cmNinjaDeps(), cmNinjaDeps(1, targetOutputReal),
        emptyDeps, emptyDeps, symlinkVars);
    }
  }

  // Add aliases for the file name and the target name.
  globalGen.AddTargetAlias(this->TargetNames.Output, &gt);
  globalGen.AddTargetAlias(this->GetTargetName(), &gt);
}